

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

char * __thiscall QFileSystemModelPrivate::index(QFileSystemModelPrivate *this,char *__s,int __c)

{
  undefined4 in_register_00000014;
  char *pcVar1;
  int visualRow;
  QFileSystemNode *parentNode;
  QFileSystemModel *q;
  QFileSystemNode *this_00;
  QFileSystemNode *parent;
  QFileSystemModelPrivate *this_01;
  
  pcVar1 = (char *)CONCAT44(in_register_00000014,__c);
  this_01 = this;
  q_func((QFileSystemModelPrivate *)__s);
  if (pcVar1 == (char *)0x0) {
    this_00 = (QFileSystemNode *)0x0;
  }
  else {
    this_00 = *(QFileSystemNode **)(pcVar1 + 0x40);
  }
  if ((pcVar1 == __s + 0x138) || (this_00 == (QFileSystemNode *)0x0)) {
    QModelIndex::QModelIndex((QModelIndex *)0xaa40e7);
  }
  else if ((pcVar1[0x4d] & 1U) == 0) {
    QModelIndex::QModelIndex((QModelIndex *)0xaa40fe);
  }
  else {
    parent = this_00;
    QFileSystemNode::visibleLocation(this_00,&this_00->fileName);
    translateVisibleLocation(this,parent,(int)((ulong)this_00 >> 0x20));
    QAbstractItemModel::createIndex
              ((QAbstractItemModel *)this_01,(int)((ulong)this >> 0x20),(int)this,parent);
  }
  return (char *)this_01;
}

Assistant:

QModelIndex QFileSystemModelPrivate::index(const QFileSystemModelPrivate::QFileSystemNode *node, int column) const
{
    Q_Q(const QFileSystemModel);
    QFileSystemModelPrivate::QFileSystemNode *parentNode = (node ? node->parent : nullptr);
    if (node == &root || !parentNode)
        return QModelIndex();

    // get the parent's row
    Q_ASSERT(node);
    if (!node->isVisible)
        return QModelIndex();

    int visualRow = translateVisibleLocation(parentNode, parentNode->visibleLocation(node->fileName));
    return q->createIndex(visualRow, column, const_cast<QFileSystemNode*>(node));
}